

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::cmComputeTargetDepends(cmComputeTargetDepends *this,cmGlobalGenerator *gg)

{
  bool bVar1;
  cmState *pcVar2;
  allocator local_79;
  string local_78;
  allocator local_51;
  string local_50;
  cmake *local_20;
  cmake *cm;
  cmGlobalGenerator *gg_local;
  cmComputeTargetDepends *this_local;
  
  cm = (cmake *)gg;
  gg_local = (cmGlobalGenerator *)this;
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::vector
            (&this->Targets);
  std::
  map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
  ::map(&this->TargetIndex);
  cmGraphAdjacencyList::cmGraphAdjacencyList(&this->InitialGraph);
  cmGraphAdjacencyList::cmGraphAdjacencyList(&this->FinalGraph);
  std::vector<int,_std::allocator<int>_>::vector(&this->ComponentHead);
  std::vector<int,_std::allocator<int>_>::vector(&this->ComponentTail);
  this->GlobalGenerator = (cmGlobalGenerator *)cm;
  local_20 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
  pcVar2 = cmake::GetState(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"GLOBAL_DEPENDS_DEBUG_MODE",&local_51);
  bVar1 = cmState::GetGlobalPropertyAsBool(pcVar2,&local_50);
  this->DebugMode = bVar1;
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pcVar2 = cmake::GetState(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"GLOBAL_DEPENDS_NO_CYCLES",&local_79);
  bVar1 = cmState::GetGlobalPropertyAsBool(pcVar2,&local_78);
  this->NoCycles = bVar1;
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return;
}

Assistant:

cmComputeTargetDepends::cmComputeTargetDepends(cmGlobalGenerator* gg)
{
  this->GlobalGenerator = gg;
  cmake* cm = this->GlobalGenerator->GetCMakeInstance();
  this->DebugMode =
    cm->GetState()->GetGlobalPropertyAsBool("GLOBAL_DEPENDS_DEBUG_MODE");
  this->NoCycles =
    cm->GetState()->GetGlobalPropertyAsBool("GLOBAL_DEPENDS_NO_CYCLES");
}